

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O3

void * __thiscall
BitSetImplement<std::bitset<128UL>,_KDefectiveSimple>::setUnion
          (BitSetImplement<std::bitset<128UL>,_KDefectiveSimple> *this,void *A,void *B)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  
  puVar3 = (ulong *)operator_new(0x10);
  uVar1 = *(ulong *)((long)A + 8);
  uVar2 = *(ulong *)((long)B + 8);
  *puVar3 = *B | *A;
  puVar3[1] = uVar2 | uVar1;
  return puVar3;
}

Assistant:

void* BitSetImplement<Bitset, Base>::setUnion(void *A, void *B) {
	Bitset *__A__ = (Bitset*) A, *__B__ = (Bitset*) B, *__C__ = new Bitset();
	*__C__ = (*__A__) | (*__B__);
	return __C__;
}